

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O0

Screen * __thiscall Screen::getInput_abi_cxx11_(Screen *this)

{
  Screen *in_RSI;
  allocator local_b9;
  string local_b8 [48];
  char local_88 [8];
  char inputText [100];
  Screen *this_local;
  string *formattedInput;
  
  std::__cxx11::string::string((string *)this);
  local_88[0] = '\0';
  clearWindow(in_RSI,in_RSI->inputScreen);
  wrefresh(in_RSI->inputScreen);
  mvwprintw(in_RSI->inputScreen,1,1,"> ");
  wgetnstr(in_RSI->inputScreen,local_88,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,local_88,&local_b9);
  std::__cxx11::string::operator=((string *)this,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return this;
}

Assistant:

std::string Screen::getInput() {
    std::string formattedInput;
    char inputText[MAX_INPUT_LENGTH];
    inputText[0] = '\0';

    // Clear the input area
    clearWindow(inputScreen);
    wrefresh(inputScreen);

    // Move the cursor to the correct location
    mvwprintw(inputScreen, 1, 1, "> ");

    // Get a string of console input
    wgetstr(inputScreen, inputText);

    formattedInput = std::string(inputText);

    return formattedInput;
}